

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

int __thiscall
cmCTestMultiProcessHandler::SearchByName(cmCTestMultiProcessHandler *this,string *name)

{
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  iterator i;
  int index;
  string *name_local;
  cmCTestMultiProcessHandler *this_local;
  
  i._M_node._4_4_ = -1;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ::begin(&(this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              );
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
         ::end(&(this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              );
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator->(&local_28);
    _Var2 = std::operator==(&ppVar3->second->Name,name);
    if (_Var2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>
               ::operator->(&local_28);
      i._M_node._4_4_ = ppVar3->first;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&local_28);
  }
  return i._M_node._4_4_;
}

Assistant:

int cmCTestMultiProcessHandler::SearchByName(std::string const& name)
{
  int index = -1;

  for (PropertiesMap::iterator i = this->Properties.begin();
       i != this->Properties.end(); ++i) {
    if (i->second->Name == name) {
      index = i->first;
    }
  }
  return index;
}